

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O2

void dasm_free(BuildCtx *ctx)

{
  dasm_State *__ptr;
  int **ppiVar1;
  long lVar2;
  
  __ptr = ctx->D;
  ppiVar1 = &__ptr->sections[0].buf;
  for (lVar2 = 0; lVar2 < __ptr->maxsection; lVar2 = lVar2 + 1) {
    free(*ppiVar1);
    ppiVar1 = ppiVar1 + 5;
  }
  free(__ptr->pclabels);
  free(__ptr->lglabels);
  free(__ptr);
  return;
}

Assistant:

void dasm_free(Dst_DECL)
{
  dasm_State *D = Dst_REF;
  int i;
  for (i = 0; i < D->maxsection; i++)
    if (D->sections[i].buf)
      DASM_M_FREE(Dst, D->sections[i].buf, D->sections[i].bsize);
  if (D->pclabels) DASM_M_FREE(Dst, D->pclabels, D->pcsize);
  if (D->lglabels) DASM_M_FREE(Dst, D->lglabels, D->lgsize);
  DASM_M_FREE(Dst, D, D->psize);
}